

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 CalcWindowSizeAfterConstraint(ImGuiWindow *window,ImVec2 new_size)

{
  long in_RDI;
  float fVar1;
  float fVar2;
  float fVar3;
  ImVec2 in_XMM0_Qa;
  ImVec2 IVar4;
  ImGuiWindow *window_for_height;
  ImGuiSizeCallbackData data;
  ImRect cr;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  float in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffff9c;
  ImGuiSizeCallbackData local_50;
  ImVec2 local_30;
  ImVec2 local_28;
  ImGuiContext *local_20;
  long local_18;
  ImVec2 local_10;
  
  local_20 = GImGui;
  local_18 = in_RDI;
  local_10 = in_XMM0_Qa;
  if (((GImGui->NextWindowData).Flags & 0x10U) != 0) {
    local_30 = (GImGui->NextWindowData).SizeConstraintRect.Min;
    local_28 = (GImGui->NextWindowData).SizeConstraintRect.Max;
    if ((local_30.x < 0.0) || (local_28.x < 0.0)) {
      in_stack_ffffffffffffff9c = *(float *)(in_RDI + 0x20);
    }
    else {
      local_10.x = in_XMM0_Qa.x;
      IVar4 = in_XMM0_Qa;
      in_stack_ffffffffffffff9c = ImClamp<float>(local_10.x,local_30.x,local_28.x);
      local_10 = IVar4;
    }
    local_10.x = in_stack_ffffffffffffff9c;
    if ((local_30.y < 0.0) || (local_28.y < 0.0)) {
      in_stack_ffffffffffffff98 = *(float *)(local_18 + 0x24);
    }
    else {
      in_stack_ffffffffffffff98 = ImClamp<float>(local_10.y,local_30.y,local_28.y);
    }
    local_10.y = in_stack_ffffffffffffff98;
    if ((local_20->NextWindowData).SizeCallback != (ImGuiSizeCallback)0x0) {
      ImGuiSizeCallbackData::ImGuiSizeCallbackData
                ((ImGuiSizeCallbackData *)
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      local_50.UserData = (local_20->NextWindowData).SizeCallbackUserData;
      local_50.Pos = *(ImVec2 *)(local_18 + 0x10);
      local_50.CurrentSize = *(ImVec2 *)(local_18 + 0x20);
      local_50.DesiredSize = local_10;
      (*(local_20->NextWindowData).SizeCallback)(&local_50);
      local_10 = local_50.DesiredSize;
    }
    local_10.y = (float)(int)local_10.y;
    local_10.x = (float)(int)local_10.x;
  }
  if ((*(uint *)(local_18 + 0xc) & 0x1000040) == 0) {
    IVar4 = ImMax((ImVec2 *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                  (ImVec2 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    local_10.y = IVar4.y;
    fVar3 = local_10.y;
    local_10 = IVar4;
    fVar1 = ImGuiWindow::TitleBarHeight((ImGuiWindow *)IVar4);
    fVar2 = ImGuiWindow::MenuBarHeight((ImGuiWindow *)IVar4);
    fVar1 = fVar1 + fVar2;
    fVar2 = ImMax<float>(0.0,(local_20->Style).WindowRounding - 1.0);
    fVar3 = ImMax<float>(fVar3,fVar1 + fVar2);
    local_10.y = fVar3;
  }
  return local_10;
}

Assistant:

static ImVec2 CalcWindowSizeAfterConstraint(ImGuiWindow* window, ImVec2 new_size)
{
    ImGuiContext& g = *GImGui;
    if (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSizeConstraint)
    {
        // Using -1,-1 on either X/Y axis to preserve the current size.
        ImRect cr = g.NextWindowData.SizeConstraintRect;
        new_size.x = (cr.Min.x >= 0 && cr.Max.x >= 0) ? ImClamp(new_size.x, cr.Min.x, cr.Max.x) : window->SizeFull.x;
        new_size.y = (cr.Min.y >= 0 && cr.Max.y >= 0) ? ImClamp(new_size.y, cr.Min.y, cr.Max.y) : window->SizeFull.y;
        if (g.NextWindowData.SizeCallback)
        {
            ImGuiSizeCallbackData data;
            data.UserData = g.NextWindowData.SizeCallbackUserData;
            data.Pos = window->Pos;
            data.CurrentSize = window->SizeFull;
            data.DesiredSize = new_size;
            g.NextWindowData.SizeCallback(&data);
            new_size = data.DesiredSize;
        }
        new_size.x = IM_FLOOR(new_size.x);
        new_size.y = IM_FLOOR(new_size.y);
    }

    // Minimum size
    if (!(window->Flags & (ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_AlwaysAutoResize)))
    {
        ImGuiWindow* window_for_height = window;
        new_size = ImMax(new_size, g.Style.WindowMinSize);
        new_size.y = ImMax(new_size.y, window_for_height->TitleBarHeight() + window_for_height->MenuBarHeight() + ImMax(0.0f, g.Style.WindowRounding - 1.0f)); // Reduce artifacts with very small windows
    }
    return new_size;
}